

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_manager.cpp
# Opt level: O1

void __thiscall
cfd::core::CfdCoreManager::Finalize
          (CfdCoreManager *this,CfdCoreHandle handle,bool is_finish_process)

{
  mutex *__mutex;
  pointer *pppiVar1;
  pointer __dest;
  int iVar2;
  pointer ppiVar3;
  undefined8 uVar4;
  pointer __src;
  int *local_40;
  CfdSourceLocation local_38;
  
  if ((this->initialized_ == true) &&
     ((this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    __mutex = &this->mutex_;
    local_40 = (int *)handle;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      uVar4 = ::std::__throw_system_error(iVar2);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar4);
    }
    ppiVar3 = (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    __dest = ppiVar3;
    for (; ppiVar3 !=
           (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
           super__Vector_impl_data._M_finish; ppiVar3 = ppiVar3 + 1) {
      __src = __dest + 1;
      if (local_40 == *ppiVar3) {
        if (local_40 != (int *)0x0) {
          operator_delete__(local_40);
        }
        if (!is_finish_process) {
          local_38.filename = "cfdcore_manager.cpp";
          local_38.line = 0x6f;
          local_38.funcname = "Finalize";
          logger::log<void*const&>(&local_38,kCfdLogLevelInfo,"core finalize. addr={:p}.",&local_40)
          ;
        }
        ppiVar3 = (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (__src != ppiVar3) {
          memmove(__dest,__src,(long)ppiVar3 - (long)__src);
        }
        pppiVar1 = &(this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppiVar1 = *pppiVar1 + -1;
        break;
      }
      __dest = __src;
    }
    if ((this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      FinalizeLogger(is_finish_process);
      wally_cleanup(0);
      this->finalized_ = true;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

void CfdCoreManager::Finalize(
    const CfdCoreHandle handle, bool is_finish_process) {
  if (initialized_ && (!handle_list_.empty())) {
    // Start of exclusive control
    std::lock_guard<std::mutex> lock(mutex_);

    std::vector<int*>::iterator ite;
    for (ite = handle_list_.begin(); ite != handle_list_.end(); ++ite) {
      if (handle == *ite) {
        delete[] static_cast<int*>(handle);
        if (!is_finish_process) {
          info(CFD_LOG_SOURCE, "core finalize. addr={:p}.", handle);
        }
        handle_list_.erase(ite);
        break;
      }
    }

    if (handle_list_.empty()) {
      // Perform end processing
      FinalizeLogger(is_finish_process);
      wally_cleanup(0);
#if 0
      hid_exit();
#endif
      finalized_ = true;
    }
  }
}